

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::hasKey(QPDFObjectHandle *this,string *key)

{
  bool bVar1;
  allocator<char> local_61;
  string local_60;
  undefined4 local_40;
  undefined1 local_30 [8];
  Dictionary dict;
  string *key_local;
  QPDFObjectHandle *this_local;
  
  dict.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)key;
  as_dictionary((QPDFObjectHandle *)local_30,(typed)this);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_30);
  if (bVar1) {
    this_local._7_1_ =
         ::qpdf::BaseDictionary::hasKey
                   ((BaseDictionary *)local_30,
                    (string *)
                    dict.super_BaseDictionary.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"returning false for a key containment request",&local_61);
    typeWarning(this,"dictionary",&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    QTC::TC("qpdf","QPDFObjectHandle dictionary false for hasKey",0);
    this_local._7_1_ = false;
  }
  local_40 = 1;
  ::qpdf::Dictionary::~Dictionary((Dictionary *)local_30);
  return this_local._7_1_;
}

Assistant:

bool
QPDFObjectHandle::hasKey(std::string const& key) const
{
    auto dict = as_dictionary(strict);
    if (dict) {
        return dict.hasKey(key);
    } else {
        typeWarning("dictionary", "returning false for a key containment request");
        QTC::TC("qpdf", "QPDFObjectHandle dictionary false for hasKey");
        return false;
    }
}